

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

string * __thiscall Database::Escape(string *__return_storage_ptr__,Database *this,string *raw)

{
  size_type sVar1;
  char *pcVar2;
  void *pvVar3;
  char *__s;
  byte *pbVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this->engine == SQLite) {
    __s = (char *)sqlite3_mprintf("%q");
    pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)__s);
    sqlite3_free(__s);
  }
  else if (this->engine == MySQL) {
    sVar1 = raw->_M_string_length;
    pvVar3 = operator_new__(sVar1 * 2 + 1);
    mysql_real_escape_string
              (((this->impl)._M_t.
                super___uniq_ptr_impl<Database::impl_,_std::default_delete<Database::impl_>_>._M_t.
                super__Tuple_impl<0UL,_Database::impl__*,_std::default_delete<Database::impl_>_>.
                super__Head_base<0UL,_Database::impl__*,_false>._M_head_impl)->field_0,pvVar3,
               (raw->_M_dataplus)._M_p,sVar1);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pvVar3);
    operator_delete__(pvVar3);
  }
  if (__return_storage_ptr__->_M_string_length != 0) {
    pbVar4 = (byte *)(__return_storage_ptr__->_M_dataplus)._M_p;
    do {
      if ((*pbVar4 - 0x23 < 0x1e) && ((0x20000003U >> (*pbVar4 - 0x23 & 0x1f) & 1) != 0)) {
        *pbVar4 = 0x3f;
      }
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (byte *)((__return_storage_ptr__->_M_dataplus)._M_p +
                               __return_storage_ptr__->_M_string_length));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Database::Escape(const std::string& raw)
{
	char *escret;
	unsigned long esclen;
	std::string result;

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			escret = new char[raw.length()*2+1];
			esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, raw.c_str(), raw.length());
			result.assign(escret, esclen);
			delete[] escret;
			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			escret = sqlite3_mprintf("%q", raw.c_str());
			result = escret;
			sqlite3_free(escret);
			break;
#endif // DATABASE_SQLITE
	}

	for (std::string::iterator it = result.begin(); it != result.end(); ++it)
	{
		if (*it == '@' || *it == '#' || *it == '$')
		{
			*it = '?';
		}
	}

	return result;
}